

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_interface.h
# Opt level: O0

void __thiscall
cppcms::session_interface::set<char[3]>(session_interface *this,string *key,char (*value) [3])

{
  char *in_RDX;
  string *in_RSI;
  string *in_RDI;
  ostringstream ss;
  string local_1c8 [48];
  locale local_198 [8];
  ostringstream local_190 [376];
  char *local_18;
  string *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::locale::classic();
  std::ios::imbue(local_198);
  std::locale::~locale(local_198);
  std::operator<<((ostream *)local_190,local_18);
  std::__cxx11::ostringstream::str();
  cppcms::session_interface::set(in_RDI,local_10);
  std::__cxx11::string::~string(local_1c8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return;
}

Assistant:

void set(std::string const &key,T const &value)
	{
		std::ostringstream ss;
		ss.imbue(std::locale::classic());
		ss<<value;
		set(key,ss.str());
	}